

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestDouble_IsNan(void)

{
  uint64_t min_double64;
  uint64_t other_nan;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  Double *in_stack_ffffffffffffffb0;
  Double *this;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Double local_18;
  undefined8 local_10;
  
  double_conversion::Double::NaN();
  double_conversion::Double::Double
            (in_stack_ffffffffffffffb0,
             (double)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  double_conversion::Double::IsNan(in_stack_ffffffffffffffb0);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(char *)in_stack_ffffffffffffffb0,
              (bool)in_stack_ffffffffffffffaf);
  local_10 = 0xffffffff00000001;
  double_conversion::Double::Double(&local_18,0xffffffff00000001);
  double_conversion::Double::IsNan(in_stack_ffffffffffffffb0);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(char *)in_stack_ffffffffffffffb0,
              (bool)in_stack_ffffffffffffffaf);
  double_conversion::Double::Infinity();
  double_conversion::Double::Double
            (in_stack_ffffffffffffffb0,
             (double)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  double_conversion::Double::IsNan(in_stack_ffffffffffffffb0);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(char *)in_stack_ffffffffffffffb0,
              (bool)in_stack_ffffffffffffffaf);
  double_conversion::Double::Infinity();
  double_conversion::Double::Double
            (in_stack_ffffffffffffffb0,
             (double)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  double_conversion::Double::IsNan(in_stack_ffffffffffffffb0);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(char *)in_stack_ffffffffffffffb0,
              (bool)in_stack_ffffffffffffffaf);
  double_conversion::Double::Double
            (in_stack_ffffffffffffffb0,
             (double)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  double_conversion::Double::IsNan(in_stack_ffffffffffffffb0);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(char *)in_stack_ffffffffffffffb0,
              (bool)in_stack_ffffffffffffffaf);
  double_conversion::Double::Double
            (in_stack_ffffffffffffffb0,
             (double)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  double_conversion::Double::IsNan(in_stack_ffffffffffffffb0);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(char *)in_stack_ffffffffffffffb0,
              (bool)in_stack_ffffffffffffffaf);
  double_conversion::Double::Double
            (in_stack_ffffffffffffffb0,
             (double)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  double_conversion::Double::IsNan(in_stack_ffffffffffffffb0);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(char *)in_stack_ffffffffffffffb0,
              (bool)in_stack_ffffffffffffffaf);
  double_conversion::Double::Double
            (in_stack_ffffffffffffffb0,
             (double)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  double_conversion::Double::IsNan(in_stack_ffffffffffffffb0);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(char *)in_stack_ffffffffffffffb0,
              (bool)in_stack_ffffffffffffffaf);
  this = (Double *)0x1;
  double_conversion::Double::Double((Double *)&stack0xffffffffffffffa8,1);
  double_conversion::Double::IsNan(this);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(char *)this,
              (bool)in_stack_ffffffffffffffaf);
  return;
}

Assistant:

TEST(Double_IsNan) {
  CHECK(Double(Double::NaN()).IsNan());
  uint64_t other_nan = DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, 00000001);
  CHECK(Double(other_nan).IsNan());
  CHECK(!Double(Double::Infinity()).IsNan());
  CHECK(!Double(-Double::Infinity()).IsNan());
  CHECK(!Double(0.0).IsNan());
  CHECK(!Double(-0.0).IsNan());
  CHECK(!Double(1.0).IsNan());
  CHECK(!Double(-1.0).IsNan());
  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  CHECK(!Double(min_double64).IsNan());
}